

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cc
# Opt level: O0

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
t_container::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_container *this)

{
  t_object *a_value;
  t_define<t_container> *this_00;
  t_object *local_68;
  wstring_view local_60;
  t_define<t_container> local_50;
  t_container *local_18;
  t_container *this_local;
  
  local_18 = this;
  this_local = (t_container *)__return_storage_ptr__;
  a_value = xemmai::t_type_of<t_pair>::f_define(this);
  xemmai::t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&this->v_type_pair,a_value);
  xemmai::t_type_of<t_queue>::f_define(this);
  xemmai::t_define<t_container>::t_define(&local_50,this);
  local_60 = sv(L"Queue",5);
  local_68 = xemmai::t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_queue);
  this_00 = xemmai::t_define<t_container>::operator()(&local_50,local_60,&local_68);
  xemmai::t_define::operator_cast_to_vector(__return_storage_ptr__,(t_define *)this_00);
  xemmai::t_define<t_container>::~t_define(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_container::f_define()
{
	v_type_pair.f_construct(t_type_of<t_pair>::f_define(this));
	t_type_of<t_queue>::f_define(this);
	return t_define(this)
	(L"Queue"sv, static_cast<t_object*>(v_type_queue))
	;
}